

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NativeCallback.h
# Opt level: O0

NativeCallback * __thiscall
flow::NativeCallback::param<std::__cxx11::string>(NativeCallback *this,string *name)

{
  vector<flow::LiteralType,_std::allocator<flow::LiteralType>_> *this_00;
  monostate local_79;
  variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
  local_78;
  value_type local_1c;
  string *local_18;
  string *name_local;
  NativeCallback *this_local;
  
  local_18 = name;
  name_local = (string *)this;
  this_00 = Signature::args(&this->signature_);
  local_1c = String;
  std::vector<flow::LiteralType,_std::allocator<flow::LiteralType>_>::push_back(this_00,&local_1c);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::push_back(&this->names_,local_18);
  std::
  variant<std::monostate,bool,std::__cxx11::string,long,flow::util::IPAddress,flow::util::Cidr,flow::util::RegExp>
  ::variant<std::monostate,void,void,std::monostate,void>
            ((variant<std::monostate,bool,std::__cxx11::string,long,flow::util::IPAddress,flow::util::Cidr,flow::util::RegExp>
              *)&local_78,&local_79);
  std::
  vector<std::variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>,_std::allocator<std::variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>_>_>
  ::push_back(&this->defaults_,(value_type *)&local_78);
  std::
  variant<std::monostate,_bool,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_long,_flow::util::IPAddress,_flow::util::Cidr,_flow::util::RegExp>
  ::~variant(&local_78);
  return this;
}

Assistant:

inline NativeCallback& NativeCallback::param<FlowString>(
    const std::string& name) {
  signature_.args().push_back(LiteralType::String);
  names_.push_back(name);
  defaults_.push_back(std::monostate{});

  return *this;
}